

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O3

void Common::refactor(TaskHandle *head)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TaskHandle task;
  TaskHandle tail;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_68 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  local_40 = p_Var1;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_58 = (element_type *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0011b0e2;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
    p_Var4 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    local_58 = (element_type *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0011b0bd;
  }
  else {
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = p_Var1;
LAB_0011b0bd:
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = (element_type *)0x0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_60._M_pi = p_Var1;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
  }
LAB_0011b0e2:
  if (local_68 != (element_type *)0x0) {
    local_38 = &(head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    do {
      iVar3 = std::__cxx11::string::compare((char *)&local_68->name);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_68->name);
        __r = local_38;
        if (iVar3 != 0) {
          if (local_58 == (element_type *)0x0) {
            (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_68;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_38,&local_60);
            local_58 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_50,__r);
            (local_68->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            p_Var1 = (local_68->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (local_68->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
          }
          else {
            (local_58->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(local_58->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_60);
            (local_68->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(local_68->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,a_Stack_50);
            local_58 = local_68;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_50,&local_60);
          }
        }
      }
      peVar2 = (local_68->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_60,
                 &(local_68->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      local_68 = peVar2;
    } while (peVar2 != (element_type *)0x0);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  p_Var4 = local_40;
  (local_58->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Var1 = (local_58->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_58->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  return;
}

Assistant:

static void refactor(TaskHandle &head) {
        TaskHandle loop_head = head, tail;
        head = nullptr;
        LOOP(task, loop_head) {
            if (not (task->isDealloc() or task->isShare())) {
                if (not tail) {
                    tail = head = task;
                    task->prev = nullptr;
                } else {
                    tail->next = task;
                    task->prev = tail;
                    tail = task;
                }
            }
        }
        tail->next = nullptr;
    }